

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O0

void setfvar(char *name,float f,bool dofunc,bool doclamp)

{
  ident *this;
  float fVar1;
  ident *id;
  bool doclamp_local;
  bool dofunc_local;
  char *pcStack_10;
  float f_local;
  char *name_local;
  
  pcStack_10 = name;
  this = hashset<ident>::access<char_const*>(&idents,&stack0xfffffffffffffff0);
  if ((this != (ident *)0x0) && (this->type == 1)) {
    if (((identflags & 0x10U) == 0) && ((this->flags & 2U) == 0)) {
      if ((this->flags & 0x10U) != 0) {
        this->flags = this->flags & 0xffffffef;
      }
    }
    else {
      if ((this->flags & 1U) != 0) {
        debugcode("cannot override persistent variable %s",this->name);
        return;
      }
      if ((this->flags & 0x10U) == 0) {
        (this->field_5).argmask = *(uint *)(this->field_4).args;
        this->flags = this->flags | 0x10;
      }
    }
    if (doclamp) {
      fVar1 = clamp<float,float>(f,(this->field_2).minvalf,(this->field_3).maxvalf);
      *(float *)(this->field_4).args = fVar1;
    }
    else {
      *(float *)(this->field_4).args = f;
    }
    if (dofunc) {
      ident::changed(this);
    }
  }
  return;
}

Assistant:

void setfvar(const char *name, float f, bool dofunc, bool doclamp)
{
    _GETVAR(id, ID_FVAR, name, );
    OVERRIDEVAR(return, id->overrideval.f = *id->storage.f, , );
    if(doclamp) *id->storage.f = clamp(f, id->minvalf, id->maxvalf);
    else *id->storage.f = f;
    if(dofunc) id->changed();
}